

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

void cf_he_close(Curl_cfilter *cf,Curl_easy *data)

{
  void *pvVar1;
  curl_trc_feat *pcVar2;
  Curl_cfilter *pCVar3;
  
  pvVar1 = cf->ctx;
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
      ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) &&
     (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"close");
  }
  cf_he_ctx_clear(cf,data);
  cf->field_0x24 = cf->field_0x24 & 0xfe;
  *(undefined4 *)((long)pvVar1 + 0x18) = 0;
  pCVar3 = cf->next;
  if (pCVar3 != (Curl_cfilter *)0x0) {
    (*(code *)pCVar3->cft->do_close)(pCVar3,data);
    Curl_conn_cf_discard_chain(&cf->next,data);
    return;
  }
  return;
}

Assistant:

static void cf_he_close(struct Curl_cfilter *cf,
                        struct Curl_easy *data)
{
  struct cf_he_ctx *ctx = cf->ctx;

  CURL_TRC_CF(data, cf, "close");
  cf_he_ctx_clear(cf, data);
  cf->connected = FALSE;
  ctx->state = SCFST_INIT;

  if(cf->next) {
    cf->next->cft->do_close(cf->next, data);
    Curl_conn_cf_discard_chain(&cf->next, data);
  }
}